

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::emit_array_copy
          (CompilerGLSL *this,char *expr,uint32_t lhs_id,uint32_t rhs_id,StorageClass param_4,
          StorageClass param_5)

{
  string local_98;
  string local_78;
  undefined1 local_48 [8];
  string lhs;
  StorageClass param_5_local;
  StorageClass param_4_local;
  uint32_t rhs_id_local;
  uint32_t lhs_id_local;
  char *expr_local;
  CompilerGLSL *this_local;
  
  lhs.field_2._8_4_ = param_5;
  lhs.field_2._12_4_ = param_4;
  ::std::__cxx11::string::string((string *)local_48);
  if (expr == (char *)0x0) {
    to_expression_abi_cxx11_(&local_78,this,lhs_id,true);
    ::std::__cxx11::string::operator=((string *)local_48,(string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    ::std::__cxx11::string::operator=((string *)local_48,expr);
  }
  to_expression_abi_cxx11_(&local_98,this,rhs_id,true);
  statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [4])0x4a41f0,&local_98,(char (*) [2])0x4af37c);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)local_48);
  return true;
}

Assistant:

bool CompilerGLSL::emit_array_copy(const char *expr, uint32_t lhs_id, uint32_t rhs_id, StorageClass, StorageClass)
{
	string lhs;
	if (expr)
		lhs = expr;
	else
		lhs = to_expression(lhs_id);

	statement(lhs, " = ", to_expression(rhs_id), ";");
	return true;
}